

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O1

void __thiscall
Js::DiagNativeStackFrame::SetRegValue(DiagNativeStackFrame *this,RegSlot slotId,Var value)

{
  int iVar1;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  Var *ppvVar5;
  undefined4 *puVar6;
  
  ppvVar5 = GetSlotOffsetLocation(this,slotId,false);
  if (ppvVar5 == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x236,"(varPtr != __null)","varPtr != NULL");
    if (!bVar4) goto LAB_008d4faf;
    *puVar6 = 0;
  }
  *ppvVar5 = value;
  if (this->m_localVarChangedOffset == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x23b,"(m_localVarChangedOffset != InvalidOffset)",
                                "m_localVarChangedOffset != InvalidOffset");
    if (!bVar4) goto LAB_008d4faf;
    *puVar6 = 0;
  }
  pvVar2 = this->m_stackAddr;
  iVar1 = this->m_localVarChangedOffset;
  if (1 < *(byte *)((long)pvVar2 + (long)iVar1)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x240,
                                "(*stackOffset == 0 || *stackOffset == FunctionBody::LocalsChangeDirtyValue)"
                                ,
                                "*stackOffset == 0 || *stackOffset == FunctionBody::LocalsChangeDirtyValue"
                               );
    if (!bVar4) {
LAB_008d4faf:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  *(undefined1 *)((long)pvVar2 + (long)iVar1) = 1;
  return;
}

Assistant:

void DiagNativeStackFrame::SetRegValue(RegSlot slotId, Var value)
    {
        Js::Var *varPtr = GetSlotOffsetLocation(slotId);
        Assert(varPtr != NULL);

        // First assign the value
        *varPtr = value;

        Assert(m_localVarChangedOffset != InvalidOffset);

        // Now change the bit in the stack which tells that current stack values got changed.
        char *stackOffset = (((char *)m_stackAddr) + m_localVarChangedOffset);

        Assert(*stackOffset == 0 || *stackOffset == FunctionBody::LocalsChangeDirtyValue);

        *stackOffset = FunctionBody::LocalsChangeDirtyValue;
    }